

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

ptr<buffer> nuraft::buffer::expand(buffer *buf,uint32_t new_size)

{
  out_of_range *poVar1;
  size_t sVar2;
  element_type *this;
  byte *__dest;
  buffer *__src;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<buffer> pVar3;
  byte *src;
  byte *dst;
  ptr<buffer> *other;
  size_t in_stack_000000b8;
  buffer *this_00;
  
  if (0x7fffffff < in_EDX) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (poVar1,"size exceed the max size that nuraft::buffer could support");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar2 = size(in_RSI);
  if (sVar2 <= in_EDX) {
    alloc(in_stack_000000b8);
    this = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x43c650);
    __dest = data_begin(this);
    __src = (buffer *)data_begin(in_RSI);
    this_00 = __src;
    sVar2 = size(in_RSI);
    memcpy(__dest,__src,sVar2);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x43c6cd);
    pos(in_RSI);
    pos(this_00,sVar2);
    pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (ptr<buffer>)pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar1,"realloc() new_size is less than old size");
  __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ptr<buffer> buffer::expand(const buffer& buf, uint32_t new_size) {
     if (new_size >= 0x80000000) {
        throw std::out_of_range( "size exceed the max size that "
                                 "nuraft::buffer could support" );
    }

    if (new_size < buf.size()) {
        throw std::out_of_range( "realloc() new_size is less than "
                                 "old size" );
    }
    ptr<buffer> other = alloc(new_size);
    byte* dst = other->data_begin();
    byte* src = buf.data_begin();
    ::memcpy(dst, src, buf.size());
    other->pos(buf.pos());
    return other;
}